

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O2

void __thiscall
Diligent::anon_unknown_0::DXCompilerImpl::Compile
          (DXCompilerImpl *this,ShaderCreateInfo *ShaderCI,ShaderVersion ShaderModel,char *Preamble,
          IDxcBlob **ppByteCodeBlob,vector<unsigned_int,_std::allocator<unsigned_int>_> *pByteCode,
          IDataBlob **ppCompilerOutput)

{
  DXCompilerTarget DVar1;
  CComPtr<IDxcBlob> CVar2;
  bool bVar3;
  ShaderVersion SVar4;
  size_t sVar5;
  Version VVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  ShaderVersion ShaderModel_00;
  wchar_t *pwVar11;
  ShaderCreateInfo *ShaderCI_00;
  uint uVar12;
  uint uVar13;
  string *this_00;
  uint uVar14;
  SHADER_TYPE ShaderType;
  uint uVar15;
  char (*in_stack_fffffffffffffe88) [21];
  CComPtr<IDxcBlob> pDXIL;
  CComPtr<IDxcBlob> pDxcLog;
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  string msg;
  String Source;
  wstring wstrEntryPoint;
  wstring wstrProfile;
  DxcDefine Defines [1];
  String Profile;
  
  pcVar10 = Preamble;
  bVar3 = IsLoaded(this);
  if (!bVar3) {
    FormatString<char[26]>(&msg,(char (*) [26])"DX compiler is not loaded");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Compile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
               ,0x2ba);
    this_00 = &msg;
    goto LAB_0028210b;
  }
  uVar12 = ShaderModel.Minor;
  SVar4 = GetMaxShaderModel(this);
  uVar15 = SVar4.Minor;
  uVar13 = ShaderModel.Major;
  bVar3 = (ulong)ShaderModel >> 0x20 == 0;
  ShaderModel_00._1_7_ = SUB87((ulong)pcVar10 >> 8,0);
  ShaderModel_00.Major._0_1_ = bVar3;
  if (!bVar3 || uVar13 != 0) {
    if (uVar13 < 6) {
      ShaderModel_00 = (ShaderVersion)&wstrEntryPoint;
      wstrEntryPoint._M_dataplus._M_p._0_1_ = 0x5f;
      wstrProfile._M_dataplus._M_p._0_4_ = uVar12;
      Profile._M_dataplus._M_p._0_4_ = uVar13;
      FormatString<char[75],unsigned_int,char,unsigned_int,char[8]>
                (&msg,(Diligent *)
                      "DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                 (char (*) [75])&Profile,(uint *)ShaderModel_00,(char *)&wstrProfile,
                 (uint *)" to 6_0",(char (*) [8])in_stack_fffffffffffffe88);
      if (DebugMessageCallback != (undefined *)0x0) {
        ShaderModel_00.Major = 0;
        ShaderModel_00.Minor = 0;
        (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
      SVar4.Major = 6;
      SVar4.Minor = 0;
      uVar15 = 0;
    }
    else {
      uVar14 = SVar4.Major;
      ShaderModel_00._1_7_ = 0;
      ShaderModel_00.Major._0_1_ = uVar14 < uVar13;
      bVar3 = uVar15 < uVar12;
      if (uVar13 != uVar14) {
        bVar3 = uVar14 < uVar13;
      }
      if (bVar3) {
        ShaderModel_00 = (ShaderVersion)Defines;
        Defines[0].Name = (LPCWSTR)CONCAT71(Defines[0].Name._1_7_,0x5f);
        wstrProfile._M_dataplus._M_p._0_4_ = uVar15;
        wstrEntryPoint._M_dataplus._M_p._0_4_ = uVar13;
        DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(DxilArgs.
                               super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x5f);
        Source._M_dataplus._M_p._0_4_ = uVar12;
        Profile._M_dataplus._M_p._0_4_ = uVar14;
        FormatString<char[46],unsigned_int,char,unsigned_int,char[30],unsigned_int,char,unsigned_int,char[21]>
                  (&msg,(Diligent *)"The maximum supported shader model by DXC is ",
                   (char (*) [46])&Profile,(uint *)ShaderModel_00,(char *)&wstrProfile,
                   (uint *)". The specified shader model ",(char (*) [30])&wstrEntryPoint,
                   (uint *)&DxilArgs,(char *)&Source,(uint *)" will be downgraded.",
                   in_stack_fffffffffffffe88);
        if (DebugMessageCallback != (undefined *)0x0) {
          ShaderModel_00.Major = 0;
          ShaderModel_00.Minor = 0;
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
      else {
        SVar4 = (ShaderVersion)((ulong)ShaderModel & 0xffffffff);
        uVar15 = uVar12;
      }
    }
  }
  ShaderType = SVar4.Major;
  GetHLSLProfileString_abi_cxx11_
            (&Profile,(Diligent *)(ulong)(ShaderCI->Desc).ShaderType,ShaderType,ShaderModel_00);
  wstrProfile._M_dataplus._M_p = (pointer)&wstrProfile.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&wstrProfile,
             CONCAT44(Profile._M_dataplus._M_p._4_4_,(uint)Profile._M_dataplus._M_p),
             Profile._M_string_length +
             CONCAT44(Profile._M_dataplus._M_p._4_4_,(uint)Profile._M_dataplus._M_p));
  pcVar10 = ShaderCI->EntryPoint;
  sVar5 = strlen(pcVar10);
  wstrEntryPoint._M_dataplus._M_p = (pointer)&wstrEntryPoint.field_2;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&wstrEntryPoint,pcVar10,pcVar10 + sVar5);
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DVar1 = (this->m_Library).m_Target;
  if (DVar1 == Vulkan) {
    msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5e2693;
    msg._M_dataplus._M_p = "-spirv";
    msg._M_string_length._0_4_ = 0x5dbe54;
    msg._M_string_length._4_4_ = 0;
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::_M_assign_aux<wchar_t_const*const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,&msg);
    if (this->m_APIVersion < 0x402000) {
      if (0x400fff < this->m_APIVersion) goto LAB_00281ee5;
    }
    else {
      bVar3 = (SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX) < ShaderType;
      if (ShaderType == (SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL)) {
        bVar3 = 2 < uVar15;
      }
      if (bVar3) {
        msg._M_dataplus._M_p = "-fspv-target-env=vulkan1.2";
        std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                  ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,
                   (wchar_t **)&msg);
      }
      else {
LAB_00281ee5:
        msg._M_dataplus._M_p = "-fspv-target-env=vulkan1.1";
        std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                  ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,
                   (wchar_t **)&msg);
      }
    }
  }
  else if (DVar1 == Direct3D12) {
    msg._M_dataplus._M_p = "-Zi";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&msg);
    msg._M_dataplus._M_p = "-Od";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&msg);
    VVar6 = DXCompilerLibrary::GetVersion(&this->m_Library);
    bVar3 = 4 < VVar6.Minor;
    if (VVar6.Major != 1) {
      bVar3 = VVar6.Major != 0;
    }
    if (bVar3) {
      msg._M_dataplus._M_p = "-Qembed_debug";
      std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
                ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&msg
                );
    }
  }
  else {
    FormatString<char[24]>(&msg,(char (*) [24])"Unknown compiler target");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Compile",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
               ,0x305);
    std::__cxx11::string::~string((string *)&msg);
  }
  pwVar11 = L"-Zpr";
  if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) ==
      SHADER_COMPILE_FLAG_NONE) {
    pwVar11 = L"-Zpc";
  }
  msg._M_dataplus._M_p = (pointer)pwVar11;
  std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
            ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,(wchar_t **)&msg);
  pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  pDxcLog.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
  pcVar10 = "";
  if (Preamble != (char *)0x0) {
    pcVar10 = Preamble;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&Source,pcVar10,(allocator<char> *)Defines);
  BuildHLSLSourceString_abi_cxx11_((String *)Defines,(Diligent *)ShaderCI,ShaderCI_00);
  std::__cxx11::string::append((string *)&Source);
  std::__cxx11::string::~string((string *)Defines);
  Defines[0].Name = L"DXCOMPILER";
  Defines[0].Value = L"1";
  msg._M_dataplus._M_p =
       (pointer)CONCAT44(Source._M_dataplus._M_p._4_4_,(uint)Source._M_dataplus._M_p);
  msg._M_string_length._0_4_ = (undefined4)Source._M_string_length;
  msg.field_2._M_allocated_capacity = (size_type)wstrEntryPoint._M_dataplus._M_p;
  msg.field_2._8_8_ = wstrProfile._M_dataplus._M_p;
  CComPtrBase<IDxcBlob>::operator&(&pDXIL.super_CComPtrBase<IDxcBlob>);
  CComPtrBase<IDxcBlob>::operator&(&pDxcLog.super_CComPtrBase<IDxcBlob>);
  bVar3 = Compile(this,(CompileAttribs *)&msg);
  HandleHLSLCompilerResult<IDxcBlob>
            (bVar3,(IDxcBlob *)pDxcLog.super_CComPtrBase<IDxcBlob>.p,&Source,
             (ShaderCI->Desc).super_DeviceObjectAttribs.Name,ppCompilerOutput);
  if ((bVar3) && (pDXIL.super_CComPtrBase<IDxcBlob>.p != (IDxcBlob *)0x0)) {
    lVar7 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x20))();
    if (lVar7 != 0) {
      if (pByteCode != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        uVar8 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x18))();
        lVar7 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x18))();
        uVar9 = (**(code **)(*(long *)pDXIL.super_CComPtrBase<IDxcBlob>.p + 0x20))();
        std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int*>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)pByteCode,uVar8,
                   lVar7 + (uVar9 & 0xfffffffffffffffc));
      }
      CVar2.super_CComPtrBase<IDxcBlob>.p = pDXIL.super_CComPtrBase<IDxcBlob>.p;
      if (ppByteCodeBlob != (IDxcBlob **)0x0) {
        pDXIL.super_CComPtrBase<IDxcBlob>.p = (CComPtrBase<IDxcBlob>)(IDxcBlob *)0x0;
        *ppByteCodeBlob = (IDxcBlob *)CVar2.super_CComPtrBase<IDxcBlob>.p;
      }
    }
  }
  std::__cxx11::string::~string((string *)&Source);
  CComPtrBase<IDxcBlob>::~CComPtrBase(&pDxcLog.super_CComPtrBase<IDxcBlob>);
  CComPtrBase<IDxcBlob>::~CComPtrBase(&pDXIL.super_CComPtrBase<IDxcBlob>);
  std::_Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>::~_Vector_base
            (&DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>);
  std::__cxx11::wstring::~wstring((wstring *)&wstrEntryPoint);
  std::__cxx11::wstring::~wstring((wstring *)&wstrProfile);
  this_00 = &Profile;
LAB_0028210b:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void DXCompilerImpl::Compile(const ShaderCreateInfo& ShaderCI,
                             ShaderVersion           ShaderModel,
                             const char*             Preamble,
                             IDxcBlob**              ppByteCodeBlob,
                             std::vector<uint32_t>*  pByteCode,
                             IDataBlob**             ppCompilerOutput) noexcept(false)
{
    if (!IsLoaded())
    {
        UNEXPECTED("DX compiler is not loaded");
        return;
    }

    ShaderVersion MaxSM = GetMaxShaderModel();

    // validate shader version
    if (ShaderModel == ShaderVersion{})
    {
        ShaderModel = MaxSM;
    }
    else if (ShaderModel.Major < 6)
    {
        LOG_INFO_MESSAGE("DXC only supports shader model 6.0+. Upgrading the specified shader model ",
                         Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " to 6_0");
        ShaderModel = ShaderVersion{6, 0};
    }
    else if (ShaderModel > MaxSM)
    {
        LOG_WARNING_MESSAGE("The maximum supported shader model by DXC is ", Uint32{MaxSM.Major}, '_', Uint32{MaxSM.Minor},
                            ". The specified shader model ", Uint32{ShaderModel.Major}, '_', Uint32{ShaderModel.Minor}, " will be downgraded.");
        ShaderModel = MaxSM;
    }

    const String       Profile = GetHLSLProfileString(ShaderCI.Desc.ShaderType, ShaderModel);
    const std::wstring wstrProfile{Profile.begin(), Profile.end()};
    const std::wstring wstrEntryPoint{ShaderCI.EntryPoint, ShaderCI.EntryPoint + strlen(ShaderCI.EntryPoint)};

    std::vector<const wchar_t*> DxilArgs;
    if (m_Library.GetTarget() == DXCompilerTarget::Direct3D12)
    {
        //DxilArgs.push_back(L"-WX");  // Warnings as errors
#ifdef DILIGENT_DEBUG
        DxilArgs.push_back(DXC_ARG_DEBUG);              // Debug info
        DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // Disable optimization
        if (m_Library.GetVersion() >= Version{1, 5})
        {
            // Silence the following warning:
            // no output provided for debug - embedding PDB in shader container.  Use -Qembed_debug to silence this warning.
            DxilArgs.push_back(L"-Qembed_debug");
        }
#else
        if (m_Library.GetVersion() >= Version{1, 5})
            DxilArgs.push_back(DXC_ARG_OPTIMIZATION_LEVEL3); // Optimization level 3
        else
            DxilArgs.push_back(DXC_ARG_SKIP_OPTIMIZATIONS); // TODO: something goes wrong if optimization is enabled
#endif
    }
    else if (m_Library.GetTarget() == DXCompilerTarget::Vulkan)
    {
        DxilArgs.assign(
            {
                L"-spirv",
                L"-fspv-reflect",
#ifdef DILIGENT_DEBUG
                DXC_ARG_SKIP_OPTIMIZATIONS,
#else
                DXC_ARG_OPTIMIZATION_LEVEL3
#endif
            });

        if (m_APIVersion >= VK_API_VERSION_1_2 && ShaderModel >= ShaderVersion{6, 3})
        {
            // Ray tracing requires SM 6.3 and Vulkan 1.2
            // Inline ray tracing requires SM 6.5 and Vulkan 1.2
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.2");
        }
        else if (m_APIVersion >= VK_API_VERSION_1_1)
        {
            // Wave operations require SM 6.0 and Vulkan 1.1
            DxilArgs.push_back(L"-fspv-target-env=vulkan1.1");
        }
    }
    else
    {
        UNEXPECTED("Unknown compiler target");
    }
    DxilArgs.push_back((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0 ?
                           DXC_ARG_PACK_MATRIX_ROW_MAJOR :
                           DXC_ARG_PACK_MATRIX_COLUMN_MAJOR);

    CComPtr<IDxcBlob> pDXIL;
    CComPtr<IDxcBlob> pDxcLog;

    IDXCompiler::CompileAttribs CA;

    String Source{Preamble != nullptr ? Preamble : ""};
    Source.append(BuildHLSLSourceString(ShaderCI));

    DxcDefine Defines[] = {{L"DXCOMPILER", L"1"}};

    CA.Source                     = Source.c_str();
    CA.SourceLength               = static_cast<Uint32>(Source.length());
    CA.EntryPoint                 = wstrEntryPoint.c_str();
    CA.Profile                    = wstrProfile.c_str();
    CA.pDefines                   = Defines;
    CA.DefinesCount               = _countof(Defines);
    CA.pArgs                      = DxilArgs.data();
    CA.ArgsCount                  = static_cast<Uint32>(DxilArgs.size());
    CA.pShaderSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
    CA.ppBlobOut                  = &pDXIL;
    CA.ppCompilerOutput           = &pDxcLog;

    bool result = Compile(CA);
    HandleHLSLCompilerResult(result, pDxcLog.p, Source, ShaderCI.Desc.Name, ppCompilerOutput);

    if (result && pDXIL && pDXIL->GetBufferSize() > 0)
    {
        if (pByteCode != nullptr)
            pByteCode->assign(static_cast<uint32_t*>(pDXIL->GetBufferPointer()),
                              static_cast<uint32_t*>(pDXIL->GetBufferPointer()) + pDXIL->GetBufferSize() / sizeof(uint32_t));

        if (ppByteCodeBlob != nullptr)
            *ppByteCodeBlob = pDXIL.Detach();
    }
}